

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register.cpp
# Opt level: O0

void __thiscall CRegister::CRegister(CRegister *this)

{
  undefined8 *in_RDI;
  uint in_stack_ffffffffffffffec;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  *(undefined4 *)(in_RDI + 4) = 0;
  in_RDI[5] = 0;
  *(undefined4 *)(in_RDI + 6) = 1;
  *(undefined4 *)((long)in_RDI + 0x34) = 0;
  mem_zero(in_RDI,in_stack_ffffffffffffffec);
  *(undefined4 *)(in_RDI + 0x1b) = 0xffffffff;
  return;
}

Assistant:

CRegister::CRegister()
{
	m_pNetServer = 0;
	m_pMasterServer = 0;
	m_pConfig = 0;
	m_pConsole = 0;

	m_RegisterState = REGISTERSTATE_START;
	m_RegisterStateStart = 0;
	m_RegisterFirst = 1;
	m_RegisterCount = 0;

	mem_zero(m_aMasterserverInfo, sizeof(m_aMasterserverInfo));
	m_RegisterRegisteredServer = -1;
}